

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

bool __thiscall QDockAreaLayout::restoreDockWidget(QDockAreaLayout *this,QDockWidget *dockWidget)

{
  long lVar1;
  undefined4 uVar2;
  QWidget *parent;
  QPlaceHolderItem *pQVar3;
  undefined4 uVar5;
  QDockWidgetPrivate *this_00;
  Data *pDVar4;
  qsizetype qVar6;
  long lVar7;
  WindowStates states;
  QDockAreaLayoutInfo *pQVar8;
  QLayoutItem *this_01;
  QMetaObject *widget;
  long lVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QRect rect;
  QList<QDockWidgetGroupWindow_*> list;
  QDockAreaLayoutItem *local_a0;
  QList<int> local_88;
  QArrayData *local_68;
  long lStack_60;
  long local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = (QArrayData *)0x0;
  lStack_60 = 0;
  local_58 = 0;
  widget = &QDockWidgetGroupWindow::staticMetaObject;
  local_a0 = (QDockAreaLayoutItem *)0x0;
  qt_qFindChildren_helper
            (this->mainWindow,0,0,&QDockWidgetGroupWindow::staticMetaObject,&local_68,0);
  lVar7 = lStack_60;
  if (local_58 != 0) {
    lVar1 = local_58 * 8;
    local_a0 = (QDockAreaLayoutItem *)0x0;
    lVar9 = 0;
    do {
      parent = *(QWidget **)(lVar7 + lVar9);
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar8 = QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)parent);
      QObject::objectName();
      QDockAreaLayoutInfo::indexOfPlaceHolder(&local_88,pQVar8,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      qVar6 = local_88.d.size;
      if ((undefined1 *)local_88.d.size != (undefined1 *)0x0) {
        QWidget::setParent(&dockWidget->super_QWidget,parent);
        pQVar8 = QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)parent);
        local_a0 = QDockAreaLayoutInfo::item(pQVar8,&local_88);
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,4,0x10);
        }
      }
    } while (((undefined1 *)qVar6 == (undefined1 *)0x0) &&
            (bVar10 = lVar1 + -8 != lVar9, lVar9 = lVar9 + 8, bVar10));
  }
  if (local_a0 == (QDockAreaLayoutItem *)0x0) {
    local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QObject::objectName();
    indexOfPlaceHolder(&local_88,this,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    qVar6 = local_88.d.size;
    if ((undefined1 *)local_88.d.size == (undefined1 *)0x0) {
      local_a0 = (QDockAreaLayoutItem *)0x0;
    }
    else {
      local_a0 = item(this,&local_88);
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,4,0x10);
      }
    }
    if ((undefined1 *)qVar6 == (undefined1 *)0x0) {
      bVar10 = false;
      goto LAB_003ffc91;
    }
  }
  pQVar3 = local_a0->placeHolderItem;
  this_01 = (QLayoutItem *)operator_new(0x18);
  QDockWidgetItem::QDockWidgetItem((QDockWidgetItem *)this_01,dockWidget);
  local_a0->widgetItem = this_01;
  if (pQVar3->window == true) {
    local_88.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    uVar2 = (pQVar3->topLevelRect).x2;
    uVar5 = (pQVar3->topLevelRect).y2;
    rect.y1.m_i = uVar5;
    rect.x1.m_i = uVar2;
    rect._8_8_ = dockWidget;
    local_88.d._0_16_ =
         constrainedRect(*(QDockAreaLayout **)&pQVar3->topLevelRect,rect,(QWidget *)widget);
    this_00 = *(QDockWidgetPrivate **)&(dockWidget->super_QWidget).field_0x8;
    local_50.d.d = (Data *)0x100000002;
    states.super_QFlagsStorageHelper<QDockWidgetPrivate::WindowState,_4>.
    super_QFlagsStorage<QDockWidgetPrivate::WindowState>.i =
         (QFlagsStorageHelper<QDockWidgetPrivate::WindowState,_4>)
         QFlags<QDockWidgetPrivate::WindowState>::initializer_list_helper
                   ((const_iterator)&local_50,(const_iterator)&local_50.d.ptr);
    QDockWidgetPrivate::setWindowState(this_00,states,(QRect *)&local_88);
  }
  (**(code **)(*(long *)&dockWidget->super_QWidget + 0x68))(dockWidget,pQVar3->hidden ^ 1);
  local_a0->placeHolderItem = (QPlaceHolderItem *)0x0;
  bVar10 = true;
  if (pQVar3 != (QPlaceHolderItem *)0x0) {
    pDVar4 = (pQVar3->objectName).d.d;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((pQVar3->objectName).d.d)->super_QArrayData,2,0x10);
      }
    }
    operator_delete(pQVar3,0x30);
  }
LAB_003ffc91:
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar10;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockAreaLayout::restoreDockWidget(QDockWidget *dockWidget)
{
    QDockAreaLayoutItem *item = nullptr;
    const auto groups =
            mainWindow->findChildren<QDockWidgetGroupWindow *>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups) {
        QList<int> index = dwgw->layoutInfo()->indexOfPlaceHolder(dockWidget->objectName());
        if (!index.isEmpty()) {
            dockWidget->setParent(dwgw);
            item = const_cast<QDockAreaLayoutItem *>(&dwgw->layoutInfo()->item(index));
            break;
        }
    }
    if (!item) {
        QList<int> index = indexOfPlaceHolder(dockWidget->objectName());
        if (index.isEmpty())
            return false;
        item = const_cast<QDockAreaLayoutItem *>(&this->item(index));
    }

    QPlaceHolderItem *placeHolder = item->placeHolderItem;
    Q_ASSERT(placeHolder != nullptr);

    item->widgetItem = new QDockWidgetItem(dockWidget);

    if (placeHolder->window) {
        const QRect r = constrainedRect(placeHolder->topLevelRect, dockWidget);
        dockWidget->d_func()->setWindowState(QDockWidgetPrivate::WindowStates(
                                            {QDockWidgetPrivate::WindowState::Floating,
                                             QDockWidgetPrivate::WindowState::Unplug}), r);
    }
    dockWidget->setVisible(!placeHolder->hidden);

    item->placeHolderItem = nullptr;
    delete placeHolder;

    return true;
}